

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_fontdef_type1.c
# Opt level: O0

HPDF_STATUS HPDF_Type1FontDef_SetWidths(HPDF_FontDef fontdef,HPDF_CharData *widths)

{
  void *pvVar1;
  uint local_3c;
  undefined2 *puStack_38;
  HPDF_UINT i;
  HPDF_CharData *dst;
  HPDF_Type1FontDefAttr attr;
  HPDF_CharData *src;
  HPDF_CharData *widths_local;
  HPDF_FontDef fontdef_local;
  
  pvVar1 = fontdef->attr;
  local_3c = 0;
  FreeWidth(fontdef);
  for (attr = (HPDF_Type1FontDefAttr)widths; *(short *)&attr->field_0x2 != -1;
      attr = (HPDF_Type1FontDefAttr)&attr->field_0x6) {
    local_3c = local_3c + 1;
  }
  *(uint *)((long)pvVar1 + 0x10) = local_3c;
  puStack_38 = (undefined2 *)HPDF_GetMem(fontdef->mmgr,*(int *)((long)pvVar1 + 0x10) * 6);
  if (puStack_38 == (undefined2 *)0x0) {
    fontdef_local = (HPDF_FontDef)HPDF_Error_GetCode(fontdef->error);
  }
  else {
    HPDF_MemSet(puStack_38,'\0',*(int *)((long)pvVar1 + 0x10) * 6);
    *(undefined2 **)((long)pvVar1 + 8) = puStack_38;
    attr = (HPDF_Type1FontDefAttr)widths;
    for (local_3c = 0; local_3c < *(uint *)((long)pvVar1 + 0x10); local_3c = local_3c + 1) {
      *puStack_38 = *(undefined2 *)attr;
      puStack_38[1] = *(undefined2 *)&attr->field_0x2;
      puStack_38[2] = *(undefined2 *)&attr->field_0x4;
      if (puStack_38[1] == 0x20) {
        fontdef->missing_width = *(HPDF_INT16 *)&attr->field_0x4;
      }
      attr = (HPDF_Type1FontDefAttr)&attr->field_0x6;
      puStack_38 = puStack_38 + 3;
    }
    fontdef_local = (HPDF_FontDef)0x0;
  }
  return (HPDF_STATUS)fontdef_local;
}

Assistant:

HPDF_STATUS
HPDF_Type1FontDef_SetWidths  (HPDF_FontDef          fontdef,
                              const HPDF_CharData*  widths)
{
    const HPDF_CharData* src = widths;
    HPDF_Type1FontDefAttr attr = (HPDF_Type1FontDefAttr)fontdef->attr;
    HPDF_CharData* dst;
    HPDF_UINT i = 0;

    HPDF_PTRACE ((" HPDF_Type1FontDef_SetWidths\n"));

    FreeWidth (fontdef);

    while (src->unicode != 0xFFFF) {
        src++;
        i++;
    }

    attr->widths_count = i;

    dst = (HPDF_CharData*)HPDF_GetMem (fontdef->mmgr, sizeof(HPDF_CharData) *
            attr->widths_count);
    if (dst == NULL)
        return HPDF_Error_GetCode (fontdef->error);

    HPDF_MemSet (dst, 0, sizeof(HPDF_CharData) * attr->widths_count);
    attr->widths = dst;

    src = widths;
    for (i = 0; i < attr->widths_count; i++) {
        dst->char_cd = src->char_cd;
        dst->unicode = src->unicode;
        dst->width = src->width;
        if (dst->unicode == 0x0020) {
            fontdef->missing_width = src->width;
        }

        src++;
        dst++;
    }

    return HPDF_OK;
}